

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.cpp
# Opt level: O3

void pbrt::InitBufferCaches(Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  if (intBufferCache == (undefined8 *)0x0) {
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x70,8);
    intBufferCache = (undefined8 *)CONCAT44(extraout_var,iVar1);
    *intBufferCache = alloc.memoryResource;
    intBufferCache[5] = 0;
    intBufferCache[1] = 0;
    intBufferCache[2] = 0;
    intBufferCache[3] = 0;
    intBufferCache[4] = 0;
    intBufferCache[6] = intBufferCache + 0xc;
    intBufferCache[7] = 1;
    *(undefined1 (*) [16])(intBufferCache + 8) = ZEXT416(0) << 0x40;
    *(undefined4 *)(intBufferCache + 10) = 0x3f800000;
    *(undefined1 (*) [16])(intBufferCache + 0xb) = ZEXT416(0) << 0x40;
    intBufferCache[0xd] = 0;
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x70,8);
    point2BufferCache = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
    *point2BufferCache = alloc.memoryResource;
    point2BufferCache[5] = 0;
    point2BufferCache[1] = 0;
    point2BufferCache[2] = 0;
    point2BufferCache[3] = 0;
    point2BufferCache[4] = 0;
    point2BufferCache[6] = point2BufferCache + 0xc;
    point2BufferCache[7] = 1;
    *(undefined1 (*) [16])(point2BufferCache + 8) = ZEXT416(0) << 0x40;
    *(undefined4 *)(point2BufferCache + 10) = 0x3f800000;
    *(undefined1 (*) [16])(point2BufferCache + 0xb) = ZEXT416(0) << 0x40;
    point2BufferCache[0xd] = 0;
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x70,8);
    point3BufferCache = (undefined8 *)CONCAT44(extraout_var_01,iVar1);
    *point3BufferCache = alloc.memoryResource;
    point3BufferCache[5] = 0;
    point3BufferCache[1] = 0;
    point3BufferCache[2] = 0;
    point3BufferCache[3] = 0;
    point3BufferCache[4] = 0;
    point3BufferCache[6] = point3BufferCache + 0xc;
    point3BufferCache[7] = 1;
    *(undefined1 (*) [16])(point3BufferCache + 8) = ZEXT416(0) << 0x40;
    *(undefined4 *)(point3BufferCache + 10) = 0x3f800000;
    *(undefined1 (*) [16])(point3BufferCache + 0xb) = ZEXT416(0) << 0x40;
    point3BufferCache[0xd] = 0;
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x70,8);
    vector3BufferCache = (undefined8 *)CONCAT44(extraout_var_02,iVar1);
    *vector3BufferCache = alloc.memoryResource;
    vector3BufferCache[5] = 0;
    vector3BufferCache[1] = 0;
    vector3BufferCache[2] = 0;
    vector3BufferCache[3] = 0;
    vector3BufferCache[4] = 0;
    vector3BufferCache[6] = vector3BufferCache + 0xc;
    vector3BufferCache[7] = 1;
    *(undefined1 (*) [16])(vector3BufferCache + 8) = ZEXT416(0) << 0x40;
    *(undefined4 *)(vector3BufferCache + 10) = 0x3f800000;
    *(undefined1 (*) [16])(vector3BufferCache + 0xb) = ZEXT416(0) << 0x40;
    vector3BufferCache[0xd] = 0;
    iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x70,8);
    normal3BufferCache = (undefined8 *)CONCAT44(extraout_var_03,iVar1);
    *normal3BufferCache = alloc.memoryResource;
    normal3BufferCache[5] = 0;
    normal3BufferCache[1] = 0;
    normal3BufferCache[2] = 0;
    normal3BufferCache[3] = 0;
    normal3BufferCache[4] = 0;
    normal3BufferCache[6] = normal3BufferCache + 0xc;
    normal3BufferCache[7] = 1;
    *(undefined1 (*) [16])(normal3BufferCache + 8) = ZEXT416(0) << 0x40;
    *(undefined4 *)(normal3BufferCache + 10) = 0x3f800000;
    *(undefined1 (*) [16])(normal3BufferCache + 0xb) = ZEXT416(0) << 0x40;
    normal3BufferCache[0xd] = 0;
    return;
  }
  LogFatal<char_const(&)[26]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache.cpp"
             ,0x13,"Check failed: %s",(char (*) [26])"intBufferCache == nullptr");
}

Assistant:

void InitBufferCaches(Allocator alloc) {
    CHECK(intBufferCache == nullptr);
    intBufferCache = alloc.new_object<BufferCache<int>>(alloc);
    point2BufferCache = alloc.new_object<BufferCache<Point2f>>(alloc);
    point3BufferCache = alloc.new_object<BufferCache<Point3f>>(alloc);
    vector3BufferCache = alloc.new_object<BufferCache<Vector3f>>(alloc);
    normal3BufferCache = alloc.new_object<BufferCache<Normal3f>>(alloc);
}